

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall
aalcalc::loadoccurrence<occurrence_granular>(aalcalc *this,occurrence_granular *occ,FILE *fin)

{
  _Rb_tree<int,std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>,std::_Select1st<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>>
  *__args;
  _Base_ptr p_Var1;
  iterator iVar2;
  size_t sVar3;
  vector<int,std::allocator<int>> *pvVar4;
  const_iterator __pos;
  FILE *__stream;
  _Base_ptr p_Var5;
  _Rb_tree<int,std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>,std::_Select1st<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>>
  *__k;
  int *piVar6;
  occurrence_granular *poVar7;
  _Rb_tree<int,std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>,std::_Select1st<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>>
  *this_00;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *unaff_R12;
  int *unaff_R13;
  tuple<> tStack_59;
  _Head_base<0UL,_int_&&,_false> _Stack_58;
  FILE *pFStack_50;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *pmStack_48;
  int *piStack_40;
  aalcalc *paStack_38;
  occurrence_granular *poStack_30;
  
  poStack_30 = (occurrence_granular *)0x104b22;
  fread(&this->no_of_periods_,4,1,(FILE *)fin);
  __k = (_Rb_tree<int,std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>,std::_Select1st<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>>
         *)0x10;
  poStack_30 = (occurrence_granular *)0x104b37;
  poVar7 = occ;
  sVar3 = fread(occ,0x10,1,(FILE *)fin);
  if (sVar3 != 0) {
    unaff_R12 = &this->event_to_period_;
    unaff_R13 = &occ->period_no;
    do {
      poStack_30 = (occurrence_granular *)0x104b4f;
      pvVar4 = (vector<int,std::allocator<int>> *)
               std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](unaff_R12,&occ->event_id);
      iVar2._M_current = *(int **)(pvVar4 + 8);
      if (iVar2._M_current == *(int **)(pvVar4 + 0x10)) {
        poStack_30 = (occurrence_granular *)0x104b74;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar4,iVar2,unaff_R13);
      }
      else {
        *iVar2._M_current = *unaff_R13;
        *(int **)(pvVar4 + 8) = iVar2._M_current + 1;
      }
      if (this->max_period_no_ < *unaff_R13) {
        this->max_period_no_ = *unaff_R13;
      }
      __k = (_Rb_tree<int,std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>,std::_Select1st<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>>
             *)0x10;
      poStack_30 = (occurrence_granular *)0x104b97;
      poVar7 = occ;
      sVar3 = fread(occ,0x10,1,(FILE *)fin);
    } while (sVar3 != 0);
  }
  if (this->max_period_no_ <= this->no_of_periods_) {
    fclose((FILE *)fin);
    return;
  }
  poStack_30 = (occurrence_granular *)loadoccurrence<occurrence>;
  loadoccurrence<occurrence_granular>();
  _Stack_58._M_head_impl = (int *)0x104be4;
  pFStack_50 = fin;
  pmStack_48 = unaff_R12;
  piStack_40 = unaff_R13;
  paStack_38 = this;
  poStack_30 = occ;
  fread(poVar7 + 6,4,1,__stream);
  piVar6 = (int *)0xc;
  _Stack_58._M_head_impl = (int *)0x104bf9;
  this_00 = __k;
  sVar3 = fread(__k,0xc,1,__stream);
  if (sVar3 != 0) {
    __args = __k + 4;
    do {
      _Stack_58._M_head_impl = (int *)0x104c11;
      pvVar4 = (vector<int,std::allocator<int>> *)
               std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)(poVar7 + 3),(key_type *)__k);
      iVar2._M_current = *(int **)(pvVar4 + 8);
      if (iVar2._M_current == *(int **)(pvVar4 + 0x10)) {
        _Stack_58._M_head_impl = (int *)0x104c36;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar4,iVar2,(int *)__args);
      }
      else {
        *iVar2._M_current = *(int *)__args;
        *(int **)(pvVar4 + 8) = iVar2._M_current + 1;
      }
      if ((int)poVar7[6].occ_date_id < *(int *)__args) {
        *(int *)&poVar7[6].occ_date_id = *(int *)__args;
      }
      piVar6 = (int *)0xc;
      _Stack_58._M_head_impl = (int *)0x104c59;
      this_00 = __k;
      sVar3 = fread(__k,0xc,1,__stream);
    } while (sVar3 != 0);
  }
  if ((int)poVar7[6].occ_date_id <= poVar7[6].event_id) {
    fclose(__stream);
    return;
  }
  _Stack_58._M_head_impl =
       (int *)std::
              map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
              ::operator[];
  loadoccurrence<occurrence>();
  p_Var5 = *(_Base_ptr *)(this_00 + 0x10);
  p_Var1 = (_Base_ptr)(this_00 + 8);
  __pos._M_node = p_Var1;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      if (*piVar6 <= (int)p_Var5[1]._M_color) {
        __pos._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < *piVar6];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  if ((__pos._M_node == p_Var1) || (*piVar6 < (int)__pos._M_node[1]._M_color)) {
    _Stack_58._M_head_impl = piVar6;
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>,std::_Select1st<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<aal_rec_period,std::allocator<aal_rec_period>>>>>
    ::_M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
              (this_00,__pos,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<int_&&> *)&_Stack_58,&tStack_59);
  }
  return;
}

Assistant:

void aalcalc::loadoccurrence(T &occ, FILE * fin)
{

	size_t i = fread(&no_of_periods_, sizeof(no_of_periods_), 1, fin);
	i = fread(&occ, sizeof(occ), 1, fin);
	while (i != 0) {
		event_to_period_[occ.event_id].push_back(occ.period_no);
		if (max_period_no_ < occ.period_no) max_period_no_ = occ.period_no;
		i = fread(&occ, sizeof(occ), 1, fin);
	}
	
	if (max_period_no_ > no_of_periods_) {
		fprintf(stderr, "FATAL: Period numbers are not contigious\n");
		exit(-1);
	}
	fclose(fin);

}